

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Box.h
# Opt level: O3

Unique<Type>_conflict5 __thiscall anurbs::Box<3L>::load(Box<3L> *this,Model *model,Json *source)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  DataReader reader;
  Vector max;
  Vector min;
  string local_a0;
  DataReader local_80;
  Matrix<double,_1,_3,_1,_1,_3> local_78;
  Matrix<double,_1,_3,_1,_1,_3> local_60;
  Matrix<double,_1,_3,_1,_1,_3> local_48;
  Matrix<double,_1,_3,_1,_1,_3> local_28;
  
  paVar1 = &local_a0.field_2;
  local_a0._M_dataplus._M_p = (pointer)paVar1;
  local_80.m_data = source;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"min","");
  local_28.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[2] =
       local_60.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
       [2];
  local_28.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[0] =
       local_60.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
       [0];
  local_28.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[1] =
       local_60.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
       [1];
  DataReader::fill_vector<Eigen::Matrix<double,1,3,1,1,3>>(&local_80,&local_a0,&local_28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  local_a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"max","");
  local_48.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[2] =
       local_78.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
       [2];
  local_48.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[0] =
       local_78.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
       [0];
  local_48.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[1] =
       local_78.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
       [1];
  DataReader::fill_vector<Eigen::Matrix<double,1,3,1,1,3>>(&local_80,&local_a0,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  new_<anurbs::Box<3l>,Eigen::Matrix<double,1,3,1,1,3>&,Eigen::Matrix<double,1,3,1,1,3>&>
            ((anurbs *)this,&local_60,&local_78);
  return (__uniq_ptr_data<anurbs::Box<3L>,_std::default_delete<anurbs::Box<3L>_>,_true,_true>)
         (__uniq_ptr_data<anurbs::Box<3L>,_std::default_delete<anurbs::Box<3L>_>,_true,_true>)this;
}

Assistant:

static Unique<Type> load(Model& model, const Json& source)
    {
        const DataReader reader(source);

        Vector min, max;

        reader.fill_vector("min", min);
        reader.fill_vector("max", max);

        return new_<Type>(min, max);
    }